

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

X509 * find_issuer(X509_STORE_CTX *ctx,stack_st_X509 *sk,X509 *x)

{
  int iVar1;
  X509 *pXVar2;
  X509 *issuer;
  size_t i;
  X509 *x_local;
  stack_st_X509 *sk_local;
  X509_STORE_CTX *ctx_local;
  
  issuer = (X509 *)0x0;
  while( true ) {
    pXVar2 = (X509 *)sk_X509_num(sk);
    if (pXVar2 <= issuer) {
      return (X509 *)0x0;
    }
    pXVar2 = sk_X509_value(sk,(size_t)issuer);
    iVar1 = x509_check_issued_with_callback(ctx,x,pXVar2);
    if (iVar1 != 0) break;
    issuer = (X509 *)((long)&issuer->cert_info + 1);
  }
  return pXVar2;
}

Assistant:

static X509 *find_issuer(X509_STORE_CTX *ctx, STACK_OF(X509) *sk, X509 *x) {
  size_t i;
  X509 *issuer;
  for (i = 0; i < sk_X509_num(sk); i++) {
    issuer = sk_X509_value(sk, i);
    if (x509_check_issued_with_callback(ctx, x, issuer)) {
      return issuer;
    }
  }
  return NULL;
}